

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

char * unescape_word(Curl_easy *data,char *inputbuff)

{
  char cVar1;
  int local_44;
  int olen;
  char ch;
  char *pcStack_38;
  int len;
  char *ptr;
  char *dictp;
  char *newp;
  char *inputbuff_local;
  Curl_easy *data_local;
  
  local_44 = 0;
  newp = inputbuff;
  inputbuff_local = (char *)data;
  dictp = curl_easy_unescape(data,inputbuff,0,&olen);
  if (dictp == (char *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    ptr = (char *)(*Curl_cmalloc)((long)olen * 2 + 1);
    if (ptr != (char *)0x0) {
      for (pcStack_38 = dictp; cVar1 = *pcStack_38, cVar1 != '\0'; pcStack_38 = pcStack_38 + 1) {
        if ((((cVar1 < '!') || (cVar1 == '\x7f')) || (cVar1 == '\'')) ||
           ((cVar1 == '\"' || (cVar1 == '\\')))) {
          ptr[local_44] = '\\';
          local_44 = local_44 + 1;
        }
        ptr[local_44] = cVar1;
        local_44 = local_44 + 1;
      }
      ptr[local_44] = '\0';
    }
    (*Curl_cfree)(dictp);
    data_local = (Curl_easy *)ptr;
  }
  return (char *)data_local;
}

Assistant:

static char *unescape_word(struct Curl_easy *data, const char *inputbuff)
{
  char *newp;
  char *dictp;
  char *ptr;
  int len;
  char ch;
  int olen=0;

  newp = curl_easy_unescape(data, inputbuff, 0, &len);
  if(!newp)
    return NULL;

  dictp = malloc(((size_t)len)*2 + 1); /* add one for terminating zero */
  if(dictp) {
    /* According to RFC2229 section 2.2, these letters need to be escaped with
       \[letter] */
    for(ptr = newp;
        (ch = *ptr) != 0;
        ptr++) {
      if((ch <= 32) || (ch == 127) ||
          (ch == '\'') || (ch == '\"') || (ch == '\\')) {
        dictp[olen++] = '\\';
      }
      dictp[olen++] = ch;
    }
    dictp[olen]=0;
  }
  free(newp);
  return dictp;
}